

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRGenerator.cc
# Opt level: O0

int __thiscall
flow::lang::IRGenerator::accept(IRGenerator *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int extraout_EAX;
  BasicBlock *pBVar1;
  Stmt *stmt;
  Expr *expr;
  Value *condValue;
  undefined4 in_register_00000034;
  Value *cond;
  string local_b0;
  BasicBlock *local_90;
  BasicBlock *doneBlock;
  string local_80;
  BasicBlock *local_60;
  BasicBlock *condBlock;
  allocator<char> local_41;
  string local_40;
  BasicBlock *local_20;
  BasicBlock *bodyBlock;
  WhileStmt *whileStmt_local;
  IRGenerator *this_local;
  
  bodyBlock = (BasicBlock *)CONCAT44(in_register_00000034,__fd);
  whileStmt_local = (WhileStmt *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"while.body",&local_41);
  pBVar1 = IRBuilder::createBlock(&this->super_IRBuilder,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  local_20 = pBVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"while.cond",(allocator<char> *)((long)&doneBlock + 7));
  pBVar1 = IRBuilder::createBlock(&this->super_IRBuilder,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)((long)&doneBlock + 7));
  local_60 = pBVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"while.done",(allocator<char> *)((long)&cond + 7));
  pBVar1 = IRBuilder::createBlock(&this->super_IRBuilder,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&cond + 7));
  local_90 = pBVar1;
  IRBuilder::createBr(&this->super_IRBuilder,local_60);
  IRBuilder::setInsertPoint(&this->super_IRBuilder,local_20);
  stmt = WhileStmt::bodyStmt((WhileStmt *)bodyBlock);
  codegen(this,stmt);
  IRBuilder::createBr(&this->super_IRBuilder,local_60);
  IRBuilder::setInsertPoint(&this->super_IRBuilder,local_60);
  expr = WhileStmt::condition((WhileStmt *)bodyBlock);
  condValue = codegen(this,expr);
  IRBuilder::createCondBr(&this->super_IRBuilder,condValue,local_20,local_90);
  IRBuilder::setInsertPoint(&this->super_IRBuilder,local_90);
  return extraout_EAX;
}

Assistant:

void IRGenerator::accept(WhileStmt& whileStmt) {
  BasicBlock* bodyBlock = createBlock("while.body");
  BasicBlock* condBlock = createBlock("while.cond");
  BasicBlock* doneBlock = createBlock("while.done");

  createBr(condBlock);

  setInsertPoint(bodyBlock);
  codegen(whileStmt.bodyStmt());
  createBr(condBlock);

  setInsertPoint(condBlock);
  Value* cond = codegen(whileStmt.condition());
  createCondBr(cond, bodyBlock, doneBlock);

  setInsertPoint(doneBlock);
}